

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::VertexIDCase::VertexIDCase
          (VertexIDCase *this,Context *context,DrawMethod drawMethod)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  DrawMethod drawMethod_local;
  Context *context_local;
  VertexIDCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,"vertex_id","gl_VertexID Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__VertexIDCase_032c0360;
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  this->m_gl = (Functions *)CONCAT44(extraout_var,iVar1);
  this->m_program = (ShaderProgram *)0x0;
  this->m_coordinatesBuffer = 0;
  this->m_elementsBuffer = 0;
  this->m_iterNdx = 0;
  this->m_method = drawMethod;
  return;
}

Assistant:

VertexIDCase::VertexIDCase (Context& context,  gls::DrawTestSpec::DrawMethod drawMethod)
	: TestCase				(context, "vertex_id", "gl_VertexID Test")
	, m_gl					(m_context.getRenderContext().getFunctions())
	, m_program				(DE_NULL)
	, m_coordinatesBuffer	(0)
	, m_elementsBuffer		(0)
	, m_iterNdx				(0)
	, m_method				(drawMethod)
{
}